

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gls::fboc::details::AttachmentTest::build(AttachmentTest *this,FboBuilder *builder)

{
  bool bVar1;
  deBool dVar2;
  GLenum GVar3;
  NotSupportedError *this_00;
  Functions *pFVar4;
  ImageFormat format;
  int local_34;
  GLint local_30;
  int i;
  GLint maxAttachments;
  ImageFormat local_20;
  FboBuilder *local_18;
  FboBuilder *builder_local;
  AttachmentTest *this_local;
  
  GVar3 = (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.color0Kind;
  local_18 = builder;
  builder_local = (FboBuilder *)this;
  local_20 = FboUtil::ImageFormat::none();
  TestBase::attachTargetToNew((TestBase *)this,0x8ce0,GVar3,local_20,0x40,0x40,local_18);
  if ((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.colornKind != 0)
  {
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) ||
         (bVar1 = Context::haveMultiColorAtts
                            ((this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).
                             super_TestBase.m_ctx), !bVar1)) {
        this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (this_00,"Multiple attachments not supported","m_ctx.haveMultiColorAtts()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFboCompletenessTests.cpp"
                   ,0x38f);
        __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
    local_30 = 1;
    pFVar4 = details::gl((TestBase *)this);
    (*pFVar4->getIntegerv)(0x8cdf,&local_30);
    pFVar4 = details::gl((TestBase *)this);
    GVar3 = (*pFVar4->getError)();
    glu::checkError(GVar3,"Couldn\'t read GL_MAX_COLOR_ATTACHMENTS",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFboCompletenessTests.cpp"
                    ,0x393);
    for (local_34 = 1; local_34 < local_30; local_34 = local_34 + 1) {
      GVar3 = (this->super_ParamTest<deqp::gls::fboc::details::AttachmentParams>).m_params.
              colornKind;
      format = FboUtil::ImageFormat::none();
      TestBase::attachTargetToNew
                ((TestBase *)this,local_34 + 0x8ce0,GVar3,format,0x40,0x40,local_18);
    }
  }
  makeDepthAndStencil(this,local_18);
  return STOP;
}

Assistant:

IterateResult AttachmentTest::build (FboBuilder& builder)
{
	attachTargetToNew(GL_COLOR_ATTACHMENT0, m_params.color0Kind, ImageFormat::none(),
					  64, 64, builder);

	if (m_params.colornKind != GL_NONE)
	{
		TCU_CHECK_AND_THROW(NotSupportedError, m_ctx.haveMultiColorAtts(),
							"Multiple attachments not supported");
		GLint maxAttachments = 1;
		gl(*this).getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &maxAttachments);
		GLU_EXPECT_NO_ERROR(
			gl(*this).getError(), "Couldn't read GL_MAX_COLOR_ATTACHMENTS");

		for (int i = 1; i < maxAttachments; i++)
		{
			attachTargetToNew(GL_COLOR_ATTACHMENT0 + i, m_params.colornKind,
							  ImageFormat::none(), 64, 64, builder);
		}
	}

	makeDepthAndStencil(builder);

	return STOP;
}